

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLMG.cpp
# Opt level: O0

void __thiscall amrex::MLMG::NSolve(MLMG *this,MLMG *a_solver,MultiFab *a_sol,MultiFab *a_rhs)

{
  initializer_list<amrex::MultiFab_*> iVar1;
  initializer_list<const_amrex::MultiFab_*> iVar2;
  bool bVar3;
  MultiFab *pMVar4;
  FabArrayBase *in_RCX;
  undefined8 in_RDX;
  size_type in_RSI;
  long in_RDI;
  MultiFab *res_bottom;
  char *in_stack_00000288;
  Real in_stack_00000290;
  Real in_stack_00000298;
  Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *in_stack_000002a0;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *in_stack_000002a8;
  MLMG *in_stack_000002b0;
  BoxArray *in_stack_fffffffffffffef8;
  FabArray<amrex::FArrayBox> *in_stack_ffffffffffffff00;
  vector<amrex::Any,_std::allocator<amrex::Any>_> *this_00;
  iterator in_stack_ffffffffffffff08;
  iterator ppMVar5;
  Any *in_stack_ffffffffffffff18;
  CpOp op;
  Any *this_01;
  undefined8 in_stack_ffffffffffffff20;
  FabArrayBase *pFVar6;
  MultiFab *in_stack_ffffffffffffff28;
  FabArray<amrex::FArrayBox> *fa;
  FabArray<amrex::FArrayBox> *in_stack_ffffffffffffff30;
  undefined1 local_a1;
  FabArrayBase *local_a0;
  FabArrayBase **local_98;
  undefined8 local_90;
  undefined1 local_59;
  undefined8 local_58;
  undefined8 *local_50;
  undefined8 local_48;
  FabArray<amrex::FArrayBox> *local_28;
  FabArrayBase *local_20;
  undefined8 local_18;
  size_type local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            (in_stack_ffffffffffffff00,(value_type)in_stack_fffffffffffffef8);
  Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
  ::operator[]((Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                *)in_stack_ffffffffffffff00,(size_type)in_stack_fffffffffffffef8);
  std::vector<amrex::Any,_std::allocator<amrex::Any>_>::back
            ((vector<amrex::Any,_std::allocator<amrex::Any>_> *)in_stack_ffffffffffffff00);
  local_28 = &Any::get<amrex::MultiFab>(in_stack_ffffffffffffff18)->super_FabArray<amrex::FArrayBox>
  ;
  FabArrayBase::boxArray(local_20);
  FabArrayBase::boxArray(&local_28->super_FabArrayBase);
  bVar3 = BoxArray::SameRefs((BoxArray *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  if (bVar3) {
    FabArrayBase::DistributionMap(local_20);
    FabArrayBase::DistributionMap(&local_28->super_FabArrayBase);
    bVar3 = DistributionMapping::SameRefs
                      ((DistributionMapping *)in_stack_ffffffffffffff00,
                       (DistributionMapping *)in_stack_fffffffffffffef8);
    if (bVar3) {
      pFVar6 = local_20;
      FabArrayBase::nComp(local_20);
      MultiFab::Copy((MultiFab *)pFVar6,in_stack_ffffffffffffff28,
                     (int)((ulong)in_stack_ffffffffffffff20 >> 0x20),(int)in_stack_ffffffffffffff20,
                     (int)((ulong)in_stack_ffffffffffffff18 >> 0x20),(int)in_stack_ffffffffffffff18)
      ;
      goto LAB_014fa00c;
    }
  }
  op = (CpOp)((ulong)in_stack_ffffffffffffff18 >> 0x20);
  FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            (in_stack_ffffffffffffff00,(value_type)in_stack_fffffffffffffef8);
  pFVar6 = local_20;
  fa = local_28;
  Periodicity::NonPeriodic();
  FabArray<amrex::FArrayBox>::ParallelCopy(in_stack_ffffffffffffff30,fa,(Periodicity *)pFVar6,op);
LAB_014fa00c:
  local_58 = local_18;
  local_50 = &local_58;
  local_48 = 1;
  this_01 = (Any *)&local_59;
  std::allocator<amrex::MultiFab_*>::allocator((allocator<amrex::MultiFab_*> *)0x14fa057);
  iVar1._M_len = local_10;
  iVar1._M_array = in_stack_ffffffffffffff08;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::vector
            ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
             in_stack_ffffffffffffff00,iVar1,(allocator_type *)in_stack_fffffffffffffef8);
  local_a0 = local_20;
  local_98 = &local_a0;
  local_90 = 1;
  ppMVar5 = (iterator)&local_a1;
  std::allocator<const_amrex::MultiFab_*>::allocator
            ((allocator<const_amrex::MultiFab_*> *)0x14fa0aa);
  iVar2._M_len = local_10;
  iVar2._M_array = ppMVar5;
  Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::vector
            ((Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)
             in_stack_ffffffffffffff00,iVar2,(allocator_type *)in_stack_fffffffffffffef8);
  solve(in_stack_000002b0,in_stack_000002a8,in_stack_000002a0,in_stack_00000298,in_stack_00000290,
        in_stack_00000288);
  Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::~Vector
            ((Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)0x14fa100)
  ;
  std::allocator<const_amrex::MultiFab_*>::~allocator
            ((allocator<const_amrex::MultiFab_*> *)0x14fa10a);
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::~Vector
            ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)0x14fa117);
  std::allocator<amrex::MultiFab_*>::~allocator((allocator<amrex::MultiFab_*> *)0x14fa124);
  this_00 = *(vector<amrex::Any,_std::allocator<amrex::Any>_> **)(in_RDI + 0x48);
  Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
  ::operator[]((Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                *)this_00,(size_type)in_stack_fffffffffffffef8);
  std::vector<amrex::Any,_std::allocator<amrex::Any>_>::back(this_00);
  pMVar4 = Any::get<amrex::MultiFab>(this_01);
  (*(code *)(this_00->super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>)._M_impl.
            super__Vector_impl_data._M_start[0x26].m_ptr._M_t.
            super___uniq_ptr_impl<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>
  )(this_00,pMVar4,local_18);
  return;
}

Assistant:

void
MLMG::NSolve (MLMG& a_solver, MultiFab& a_sol, MultiFab& a_rhs)
{
    BL_PROFILE("MLMG::NSolve()");

    a_sol.setVal(0.0);

    MultiFab const& res_bottom = res[0].back().get<MultiFab>();
    if (BoxArray::SameRefs(a_rhs.boxArray(),res_bottom.boxArray()) &&
        DistributionMapping::SameRefs(a_rhs.DistributionMap(),res_bottom.DistributionMap()))
    {
        MultiFab::Copy(a_rhs, res_bottom, 0, 0, a_rhs.nComp(), 0);
    } else {
        a_rhs.setVal(0.0);
        a_rhs.ParallelCopy(res_bottom);
    }

    a_solver.solve({&a_sol}, {&a_rhs}, Real(-1.0), Real(-1.0));

    linop.copyNSolveSolution(cor[0].back().get<MultiFab>(), a_sol);
}